

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  u8 uVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  undefined7 in_register_00000009;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint *puVar12;
  CellInfo info;
  CellInfo local_50;
  undefined1 uVar7;
  undefined1 uVar8;
  
  if ((int)CONCAT71(in_register_00000009,eType) == 4) {
    uVar3 = *(uint *)pPage->aData;
    if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) == iFrom)
    {
      *(Pgno *)pPage->aData =
           iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
      return 0;
    }
    uVar10 = 0xccb3;
  }
  else {
    uVar1 = pPage->isInit;
    btreeInitPage(pPage);
    uVar2 = pPage->nCell;
    if (uVar2 == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      do {
        puVar12 = (uint *)(pPage->aData +
                          (CONCAT11(pPage->aCellIdx[uVar11 * 2],pPage->aCellIdx[uVar11 * 2 + 1]) &
                          pPage->maskPage));
        uVar6 = (undefined1)(iTo >> 0x18);
        uVar7 = (undefined1)(iTo >> 0x10);
        uVar8 = (undefined1)(iTo >> 8);
        if (eType == '\x03') {
          btreeParseCellPtr(pPage,(u8 *)puVar12,&local_50);
          uVar9 = (ulong)local_50.iOverflow;
          bVar4 = true;
          bVar5 = false;
          if ((uVar9 != 0) &&
             (bVar5 = false, (u8 *)((long)puVar12 + uVar9 + 3) <= pPage->aData + pPage->maskPage)) {
            puVar12 = (uint *)((long)puVar12 + uVar9);
            uVar3 = *puVar12;
            if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) ==
                iFrom) {
              *(undefined1 *)puVar12 = uVar6;
              *(undefined1 *)((long)puVar12 + 1) = uVar7;
              *(undefined1 *)((long)puVar12 + 2) = uVar8;
              *(char *)((long)puVar12 + 3) = (char)iTo;
              bVar5 = true;
              bVar4 = false;
            }
          }
          if (bVar4) {
LAB_00134fb3:
            bVar5 = false;
          }
        }
        else {
          uVar3 = *puVar12;
          if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) !=
              iFrom) goto LAB_00134fb3;
          *(undefined1 *)puVar12 = uVar6;
          *(undefined1 *)((long)puVar12 + 1) = uVar7;
          *(undefined1 *)((long)puVar12 + 2) = uVar8;
          *(char *)((long)puVar12 + 3) = (char)iTo;
          bVar5 = true;
        }
        if (bVar5) goto LAB_00134ffe;
        uVar11 = uVar11 + 1;
      } while ((uint)uVar2 != uVar11);
      uVar11 = (ulong)(uint)uVar2;
    }
LAB_00134ffe:
    if ((uint)uVar11 != (uint)uVar2) {
LAB_00135026:
      pPage->isInit = uVar1;
      return 0;
    }
    if (eType == '\x05') {
      uVar3 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
      if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) == iFrom
         ) {
        *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
             iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
        goto LAB_00135026;
      }
    }
    uVar10 = 0xccd5;
  }
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar10,
              "118a3b35693b134d56ebd780123b7fd6f1497668");
  return 0xb;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_BKPT;
    }
    put4byte(pPage->aData, iTo);
  }else{
    u8 isInitOrig = pPage->isInit;
    int i;
    int nCell;

    btreeInitPage(pPage);
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        btreeParseCellPtr(pPage, pCell, &info);
        if( info.iOverflow
         && pCell+info.iOverflow+3<=pPage->aData+pPage->maskPage
         && iFrom==get4byte(&pCell[info.iOverflow])
        ){
          put4byte(&pCell[info.iOverflow], iTo);
          break;
        }
      }else{
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }
  
    if( i==nCell ){
      if( eType!=PTRMAP_BTREE || 
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_BKPT;
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }

    pPage->isInit = isInitOrig;
  }
  return SQLITE_OK;
}